

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unary_executor.hpp
# Opt level: O3

void duckdb::UnaryExecutor::
     ExecuteStandard<double,double,duckdb::UnaryOperatorWrapper,duckdb::NoInfiniteDoubleWrapper<duckdb::CosOperator>>
               (Vector *input,Vector *result,idx_t count,void *dataptr,bool adds_nulls,
               FunctionErrors errors)

{
  Vector VVar1;
  double *pdVar2;
  double *pdVar3;
  optional_idx sel_vector;
  VectorBuffer *pVVar4;
  idx_t iVar5;
  SelectionVector *pSVar6;
  VectorType VVar7;
  double dVar8;
  optional_idx dict_size;
  optional_idx local_78;
  double *local_70;
  ValidityMask local_68;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  VVar1 = *input;
  VVar7 = (VectorType)result;
  if (VVar1 == (Vector)0x0) {
    duckdb::Vector::SetVectorType(VVar7);
    pdVar2 = *(double **)(result + 0x20);
    pdVar3 = *(double **)(input + 0x20);
    FlatVector::VerifyFlatVector(input);
    FlatVector::VerifyFlatVector(result);
    ExecuteFlat<double,double,duckdb::UnaryOperatorWrapper,duckdb::NoInfiniteDoubleWrapper<duckdb::CosOperator>>
              (pdVar3,pdVar2,count,(ValidityMask *)(input + 0x28),(ValidityMask *)(result + 0x28),
               dataptr,adds_nulls);
  }
  else {
    if (VVar1 == (Vector)0x3) {
      if (errors == CANNOT_ERROR) {
        DictionaryVector::VerifyDictionary(input);
        pVVar4 = shared_ptr<duckdb::VectorBuffer,_true>::operator->
                           ((shared_ptr<duckdb::VectorBuffer,_true> *)(input + 0x48));
        local_78.index = *(idx_t *)(pVVar4 + 0x48);
        if (((SelectionVector *)local_78.index != (SelectionVector *)0xffffffffffffffff) &&
           (iVar5 = optional_idx::GetIndex(&local_78), iVar5 * 2 <= count)) {
          DictionaryVector::VerifyDictionary(input);
          pVVar4 = shared_ptr<duckdb::VectorBuffer,_true>::operator->
                             ((shared_ptr<duckdb::VectorBuffer,_true> *)(input + 0x58));
          if (pVVar4[0x30] == (VectorBuffer)0x0) {
            pdVar2 = *(double **)(result + 0x20);
            pdVar3 = *(double **)(pVVar4 + 0x50);
            iVar5 = optional_idx::GetIndex(&local_78);
            FlatVector::VerifyFlatVector((Vector *)(pVVar4 + 0x30));
            FlatVector::VerifyFlatVector(result);
            ExecuteFlat<double,double,duckdb::UnaryOperatorWrapper,duckdb::NoInfiniteDoubleWrapper<duckdb::CosOperator>>
                      (pdVar3,pdVar2,iVar5,(ValidityMask *)(pVVar4 + 0x58),
                       (ValidityMask *)(result + 0x28),dataptr,adds_nulls);
            DictionaryVector::VerifyDictionary(input);
            pVVar4 = shared_ptr<duckdb::VectorBuffer,_true>::operator->
                               ((shared_ptr<duckdb::VectorBuffer,_true> *)(input + 0x48));
            pSVar6 = (SelectionVector *)optional_idx::GetIndex(&local_78);
            duckdb::Vector::Dictionary(result,(ulong)result,pSVar6,(ulong)(pVVar4 + 0x30));
            return;
          }
        }
      }
    }
    else if (VVar1 == (Vector)0x2) {
      duckdb::Vector::SetVectorType(VVar7);
      pdVar2 = *(double **)(result + 0x20);
      pdVar3 = *(double **)(input + 0x20);
      if ((*(byte **)(input + 0x28) != (byte *)0x0) && ((**(byte **)(input + 0x28) & 1) == 0)) {
        duckdb::ConstantVector::SetNull(result,true);
        return;
      }
      duckdb::ConstantVector::SetNull(result,false);
      dVar8 = NoInfiniteDoubleWrapper<duckdb::CosOperator>::Operation<double,double>(*pdVar3);
      *pdVar2 = dVar8;
      return;
    }
    duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_78);
    duckdb::Vector::ToUnifiedFormat((ulong)input,(UnifiedVectorFormat *)count);
    duckdb::Vector::SetVectorType(VVar7);
    sel_vector.index = local_78.index;
    pdVar2 = *(double **)(result + 0x20);
    FlatVector::VerifyFlatVector(result);
    ExecuteLoop<double,double,duckdb::UnaryOperatorWrapper,duckdb::NoInfiniteDoubleWrapper<duckdb::CosOperator>>
              (local_70,pdVar2,count,(SelectionVector *)sel_vector.index,&local_68,
               (ValidityMask *)(result + 0x28),dataptr,adds_nulls);
    if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
    }
    if (local_68.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_68.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
  }
  return;
}

Assistant:

static inline void ExecuteStandard(Vector &input, Vector &result, idx_t count, void *dataptr, bool adds_nulls,
	                                   FunctionErrors errors = FunctionErrors::CAN_THROW_RUNTIME_ERROR) {
		switch (input.GetVectorType()) {
		case VectorType::CONSTANT_VECTOR: {
			result.SetVectorType(VectorType::CONSTANT_VECTOR);
			auto result_data = ConstantVector::GetData<RESULT_TYPE>(result);
			auto ldata = ConstantVector::GetData<INPUT_TYPE>(input);

			if (ConstantVector::IsNull(input)) {
				ConstantVector::SetNull(result, true);
			} else {
				ConstantVector::SetNull(result, false);
				*result_data = OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(
				    *ldata, ConstantVector::Validity(result), 0, dataptr);
			}
			break;
		}
#ifndef DUCKDB_SMALLER_BINARY
		case VectorType::FLAT_VECTOR: {
			result.SetVectorType(VectorType::FLAT_VECTOR);
			auto result_data = FlatVector::GetData<RESULT_TYPE>(result);
			auto ldata = FlatVector::GetData<INPUT_TYPE>(input);

			ExecuteFlat<INPUT_TYPE, RESULT_TYPE, OPWRAPPER, OP>(ldata, result_data, count, FlatVector::Validity(input),
			                                                    FlatVector::Validity(result), dataptr, adds_nulls);
			break;
		}
		case VectorType::DICTIONARY_VECTOR: {
			// dictionary vector - we can run the function ONLY on the dictionary in some cases
			// we can only do this if the function does not throw errors
			// we can execute the function on a value that is in the dictionary but that is not referenced
			// if the function can throw errors - this will result in us (incorrectly) throwing an error
			if (errors == FunctionErrors::CANNOT_ERROR) {
				static constexpr idx_t DICTIONARY_THRESHOLD = 2;
				auto dict_size = DictionaryVector::DictionarySize(input);
				if (dict_size.IsValid() && dict_size.GetIndex() * DICTIONARY_THRESHOLD <= count) {
					// we can operate directly on the dictionary if we have a dictionary size
					// but this only makes sense if the dictionary size is smaller than the count by some factor
					auto &dictionary_values = DictionaryVector::Child(input);
					if (dictionary_values.GetVectorType() == VectorType::FLAT_VECTOR) {
						// execute the function over the dictionary
						auto result_data = FlatVector::GetData<RESULT_TYPE>(result);
						auto ldata = FlatVector::GetData<INPUT_TYPE>(dictionary_values);
						ExecuteFlat<INPUT_TYPE, RESULT_TYPE, OPWRAPPER, OP>(
						    ldata, result_data, dict_size.GetIndex(), FlatVector::Validity(dictionary_values),
						    FlatVector::Validity(result), dataptr, adds_nulls);
						// slice the result with the original offsets
						auto &offsets = DictionaryVector::SelVector(input);
						result.Dictionary(result, dict_size.GetIndex(), offsets, count);
						break;
					}
				}
			}
			DUCKDB_EXPLICIT_FALLTHROUGH;
		}
#endif
		default: {
			UnifiedVectorFormat vdata;
			input.ToUnifiedFormat(count, vdata);

			result.SetVectorType(VectorType::FLAT_VECTOR);
			auto result_data = FlatVector::GetData<RESULT_TYPE>(result);
			auto ldata = UnifiedVectorFormat::GetData<INPUT_TYPE>(vdata);

			ExecuteLoop<INPUT_TYPE, RESULT_TYPE, OPWRAPPER, OP>(ldata, result_data, count, vdata.sel, vdata.validity,
			                                                    FlatVector::Validity(result), dataptr, adds_nulls);
			break;
		}
		}
	}